

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeotriangle.cpp
# Opt level: O3

void __thiscall
pzgeom::TPZGeoTriangle::Jacobian
          (TPZGeoTriangle *this,TPZFMatrix<double> *coord,TPZVec<double> *param,
          TPZFMatrix<double> *jacobian,TPZFMatrix<double> *axes,REAL *detjac,
          TPZFMatrix<double> *jacinv)

{
  int64_t iVar1;
  double *pdVar2;
  bool bVar3;
  uint uVar4;
  bool bVar5;
  int i;
  long lVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  ulong uVar10;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar11;
  TPZFNMatrix<6,_double> VecMatrix;
  TPZFNMatrix<6,_double> dphi;
  TPZFNMatrix<6,_double> axest;
  TPZFNMatrix<3,_double> phi;
  double local_378;
  TPZFMatrix<double> local_338;
  double local_2a8 [7];
  TPZFMatrix<double> local_270;
  double local_1e0 [7];
  TPZFMatrix<double> local_1a8;
  double local_118 [7];
  TPZFMatrix<double> local_e0;
  double local_50 [4];
  
  iVar1 = (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  (*(jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (jacobian,2,2);
  (*(axes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (axes,2,3);
  (*(jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (jacinv,2,2);
  local_e0.fElem = local_50;
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018454a8;
  local_e0.fSize = 3;
  local_e0.fGiven = local_e0.fElem;
  TPZVec<int>::TPZVec(&local_e0.fPivot.super_TPZVec<int>,0);
  local_e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_e0.fPivot.super_TPZVec<int>.fStore = local_e0.fPivot.fExtAlloc;
  local_e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_e0.fWork.fStore = (double *)0x0;
  local_e0.fWork.fNElements = 0;
  local_e0.fWork.fNAlloc = 0;
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018451b8;
  local_270.fElem = local_1e0;
  local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01883a30;
  local_270.fSize = 6;
  local_270.fGiven = local_270.fElem;
  TPZVec<int>::TPZVec(&local_270.fPivot.super_TPZVec<int>,0);
  local_270.fPivot.super_TPZVec<int>.fStore = local_270.fPivot.fExtAlloc;
  local_270.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_270.fPivot.super_TPZVec<int>.fNElements = 0;
  local_270.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_270.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_270.fWork.fStore = (double *)0x0;
  local_270.fWork.fNElements = 0;
  local_270.fWork.fNAlloc = 0;
  local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01883740;
  local_1a8.fElem = local_118;
  local_1a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_1a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
  local_1a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1a8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01883a30;
  local_1a8.fSize = 6;
  local_1a8.fGiven = local_1a8.fElem;
  TPZVec<int>::TPZVec(&local_1a8.fPivot.super_TPZVec<int>,0);
  local_1a8.fPivot.super_TPZVec<int>.fStore = local_1a8.fPivot.fExtAlloc;
  local_1a8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_1a8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1a8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1a8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_1a8.fWork.fStore = (double *)0x0;
  local_1a8.fWork.fNElements = 0;
  local_1a8.fWork.fNAlloc = 0;
  local_1a8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01883740;
  (*(jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
            ();
  pztopology::TPZTriangle::TShape<double>(param,&local_e0,&local_270);
  local_338.fElem = local_2a8;
  local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
  local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01883a30;
  local_338.fSize = 6;
  local_338.fGiven = local_338.fElem;
  TPZVec<int>::TPZVec(&local_338.fPivot.super_TPZVec<int>,0);
  local_338.fPivot.super_TPZVec<int>.fStore = local_338.fPivot.fExtAlloc;
  local_338.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_338.fPivot.super_TPZVec<int>.fNElements = 0;
  local_338.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_338.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_338.fWork.fStore = (double *)0x0;
  local_338.fWork.fNElements = 0;
  local_338.fWork.fNAlloc = 0;
  local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01883740;
  TPZFMatrix<double>::operator=(&local_338,0.0);
  uVar4 = (uint)iVar1;
  lVar6 = 0;
  do {
    if (0 < (int)uVar4) {
      uVar10 = 0;
      do {
        (*(coord->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(coord,uVar10,lVar6);
        if ((local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
           (local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar6)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar10) ||
           (local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_338.fElem[uVar10] =
             extraout_XMM0_Qa *
             local_270.fElem[local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar6] +
             local_338.fElem[uVar10];
        (*(coord->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(coord,uVar10,lVar6);
        if ((local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
           (local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar6)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar10) ||
           (local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_338.fElem[local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + uVar10] =
             extraout_XMM0_Qa_00 *
             local_270.fElem[local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar6 + 1]
             + local_338.fElem[local_338.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + uVar10];
        uVar10 = uVar10 + 1;
      } while ((uVar4 & 0x7fffffff) != uVar10);
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  TPZFMatrix<double>::GramSchmidt(&local_338,&local_1a8,jacobian);
  TPZFMatrix<double>::Transpose(&local_1a8,&axes->super_TPZMatrix<double>);
  lVar6 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  lVar8 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  if (lVar8 < 1 || lVar6 < 1) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar2 = jacobian->fElem;
  if (lVar8 < 2 || lVar6 < 2) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((lVar6 < 2) || (lVar8 < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((lVar6 < 1) || (lVar8 < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *detjac = *pdVar2 * pdVar2[lVar6 + 1] - pdVar2[1] * pdVar2[lVar6];
  local_378 = 0.0;
  lVar8 = 0;
  bVar3 = true;
  do {
    bVar5 = bVar3;
    lVar7 = 0;
    bVar3 = true;
    do {
      bVar9 = bVar3;
      if ((lVar6 <= lVar8) ||
         ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar7)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      dVar11 = local_378;
      if (local_378 <= ABS(pdVar2[lVar7 * lVar6 + lVar8])) {
        dVar11 = ABS(pdVar2[lVar7 * lVar6 + lVar8]);
      }
      lVar7 = 1;
      bVar3 = false;
      local_378 = dVar11;
    } while (bVar9);
    lVar8 = 1;
    bVar3 = false;
  } while (bVar5);
  if ((dVar11 < 1e-12) || (local_378 = *detjac, ABS(local_378 / (dVar11 * dVar11)) < 1e-12)) {
    *detjac = 1e-12;
    local_378 = 1e-12;
  }
  if ((lVar6 < 2) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *jacinv->fElem = pdVar2[lVar6 + 1] / local_378;
  if ((lVar6 < 1) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar6 = (jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((1 < lVar6) && (1 < (jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
    jacinv->fElem[lVar6 + 1] = *jacobian->fElem / *detjac;
    lVar8 = (jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if ((lVar8 < 1) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar6 < 1) || ((jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    jacinv->fElem[lVar6] = -jacobian->fElem[lVar8] / *detjac;
    if ((lVar8 < 2) || ((jacobian->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((1 < lVar6) && (0 < (jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
      jacinv->fElem[1] = -jacobian->fElem[1] / *detjac;
      TPZFMatrix<double>::~TPZFMatrix(&local_338,&PTR_PTR_018839f8);
      TPZFMatrix<double>::~TPZFMatrix(&local_1a8,&PTR_PTR_018839f8);
      TPZFMatrix<double>::~TPZFMatrix(&local_270,&PTR_PTR_018839f8);
      TPZFMatrix<double>::~TPZFMatrix(&local_e0,&PTR_PTR_01845470);
      return;
    }
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZGeoTriangle::Jacobian(const TPZFMatrix<REAL> & coord, TPZVec<REAL> &param,TPZFMatrix<REAL> &jacobian,TPZFMatrix<REAL> &axes,REAL &detjac,TPZFMatrix<REAL> &jacinv){
		
        int spacedim = coord.Rows();
        jacobian.Resize(2,2); axes.Resize(2,3); jacinv.Resize(2,2);
		TPZFNMatrix<3> phi(3,1);
        TPZFNMatrix<6> dphi(2,3),axest(3,2);
		jacobian.Zero();
		Shape(param,phi,dphi);
        TPZFNMatrix<6> VecMatrix(3,2,0.);
        for(int i = 0; i < 3; i++) {
			for(int j = 0; j < spacedim; j++) {
				VecMatrix(j,0) += coord.GetVal(j,i)*dphi(0,i);
				VecMatrix(j,1) += coord.GetVal(j,i)*dphi(1,i);
			}
        }
        VecMatrix.GramSchmidt(axest,jacobian);
        axest.Transpose(&axes);
		detjac = jacobian(0,0)*jacobian(1,1)-jacobian(1,0)*jacobian(0,1);
    REAL maxjac = 0.;
    for (int i=0; i<2; i++) {
      for (int j=0; j<2; j++) {
        maxjac = Max(maxjac,fabs(jacobian(i,j)));
      }
    }
        if(IsZero(maxjac) || IsZero(detjac/(maxjac*maxjac)))
		{
#ifdef PZDEBUG
			std::stringstream sout;
			sout << "Singular Jacobian " << detjac;
			LOGPZ_ERROR(logger, sout.str())
#endif
			detjac = ZeroTolerance();
		}
        
        jacinv(0,0) =  jacobian(1,1)/detjac;
        jacinv(1,1) =  jacobian(0,0)/detjac;
        jacinv(0,1) = -jacobian(0,1)/detjac;
        jacinv(1,0) = -jacobian(1,0)/detjac;
	}